

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  BVH *bvh;
  size_t sVar2;
  Ref<embree::Geometry> *pRVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  Geometry *pGVar15;
  undefined4 in_EAX;
  int iVar16;
  uint uVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined4 uVar23;
  Geometry *pGVar24;
  Intersectors *pIVar25;
  NodeRef root;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar30;
  ulong uVar31;
  long lVar32;
  NodeRef *pNVar33;
  bool bVar34;
  float fVar35;
  float fVar47;
  float fVar48;
  vint4 ai;
  undefined1 auVar36 [16];
  float fVar49;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar50;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar56;
  float fVar57;
  float fVar67;
  float fVar68;
  undefined1 auVar58 [16];
  float fVar70;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar69;
  float fVar71;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar72;
  float fVar73;
  float fVar76;
  float fVar77;
  float fVar78;
  vint4 ai_1;
  undefined1 auVar74 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  vint4 ai_3;
  float fVar83;
  float fVar84;
  float fVar89;
  float fVar90;
  vint4 bi_3;
  float fVar91;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar88;
  float fVar92;
  float fVar97;
  float fVar98;
  vint4 bi;
  undefined1 auVar93 [16];
  float fVar99;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar100;
  float fVar101;
  float fVar103;
  float fVar105;
  vint4 bi_1;
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar102 [16];
  uint uVar109;
  float fVar110;
  float fVar111;
  uint uVar119;
  float fVar121;
  uint uVar122;
  float fVar123;
  vint4 ai_2;
  undefined1 auVar112 [16];
  uint uVar124;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar120;
  undefined1 auVar118 [16];
  float fVar125;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  vint4 bi_2;
  uint uVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar136 [16];
  uint uVar143;
  uint uVar148;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar156;
  float fVar158;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar153;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  TravRayK<4,_true> *tray_00;
  size_t sVar178;
  Precalculations pre;
  vuint<4> *v;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  vbool<4> terminated;
  char *pcStack_19b0;
  uint local_19a8;
  uint uStack_19a4;
  uint uStack_19a0;
  uint uStack_199c;
  Vec3<embree::vfloat_impl<4>_> p0;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  TravRayK<4,_true> tray;
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  float local_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1790;
  undefined8 uStack_1780;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar75 [16];
  undefined1 auVar117 [16];
  undefined1 auVar144 [16];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar115._8_4_ = 0xffffffff;
    auVar115._0_8_ = 0xffffffffffffffff;
    auVar115._12_4_ = 0xffffffff;
    auVar93 = *(undefined1 (*) [16])(ray + 0x80);
    auVar146._0_12_ = ZEXT812(0);
    auVar146._12_4_ = 0;
    uVar143 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar93._0_4_);
    uVar148 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar93._4_4_);
    auVar144._0_8_ = CONCAT44(uVar148,uVar143);
    auVar144._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar93._8_4_);
    auVar144._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar93._12_4_);
    iVar16 = movmskps(in_EAX,auVar144);
    if (iVar16 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar162 = (float)DAT_01feca10;
      fVar166 = DAT_01feca10._4_4_;
      fVar170 = DAT_01feca10._8_4_;
      fVar174 = DAT_01feca10._12_4_;
      auVar112 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      fVar134 = (float)DAT_01ff1d40;
      fVar137 = DAT_01ff1d40._4_4_;
      fVar139 = DAT_01ff1d40._8_4_;
      fVar141 = DAT_01ff1d40._12_4_;
      auVar58._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar137);
      auVar58._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar134);
      auVar58._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar139);
      auVar58._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar141);
      auVar74 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar155._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar137);
      auVar155._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar134);
      auVar51 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar112,_DAT_0201c930,auVar58)
      ;
      auVar155._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar139);
      auVar155._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar141);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar74,_DAT_0201c930,auVar155)
      ;
      auVar74._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar137);
      auVar74._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar134);
      auVar74._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar139);
      auVar74._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar141);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar51,_DAT_0201c930,auVar74);
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar51._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar51._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar51._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar51._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar51);
      auVar112._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar112._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar112._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar112._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar112);
      auVar58 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar146);
      auVar36._8_4_ = auVar144._8_4_;
      auVar36._0_8_ = auVar144._0_8_;
      auVar36._12_4_ = auVar144._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar58,auVar36);
      auVar93 = maxps(auVar93,auVar146);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar93,auVar36);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar115 ^ auVar144);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar29 = 3;
      }
      else {
        uVar29 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar30 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01feb9f0;
      sVar178 = (bvh->root).ptr;
      stack_node[1].ptr = sVar178;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar30 = paVar30 + -1;
        root.ptr = pNVar33[-1].ptr;
        pNVar33 = pNVar33 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00244857:
          sVar178 = 3;
        }
        else {
          aVar59.v = *(__m128 *)paVar30->v;
          auVar93._4_4_ = -(uint)(aVar59.v[1] < tray.tfar.field_0.v[1]);
          auVar93._0_4_ = -(uint)(aVar59.v[0] < tray.tfar.field_0.v[0]);
          auVar93._8_4_ = -(uint)(aVar59.v[2] < tray.tfar.field_0.v[2]);
          auVar93._12_4_ = -(uint)(aVar59.v[3] < tray.tfar.field_0.v[3]);
          uVar17 = movmskps((int)sVar178,auVar93);
          if (uVar17 == 0) {
LAB_0024485c:
            sVar178 = 2;
          }
          else {
            uVar18 = (ulong)(uVar17 & 0xff);
            uVar17 = POPCOUNT(uVar17 & 0xff);
            sVar178 = 0;
            if (uVar17 <= uVar29) {
              do {
                sVar178 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> sVar178 & 1) == 0; sVar178 = sVar178 + 1) {
                  }
                }
                tray_00 = &tray;
                valid_i = (vint<4> *)This;
                bVar34 = occluded1(This,bvh,root,sVar178,&pre,ray,tray_00,context);
                if (bVar34) {
                  terminated.field_0.i[sVar178] = -1;
                }
                uVar18 = uVar18 & uVar18 - 1;
              } while (uVar18 != 0);
              iVar16 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
              sVar178 = 3;
              fVar162 = 1.0;
              fVar166 = 1.0;
              fVar170 = 1.0;
              fVar174 = 1.0;
              if (iVar16 != 0xf) {
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                              (undefined1  [16])terminated.field_0);
                sVar178 = 2;
              }
            }
            if (uVar29 < uVar17) {
              do {
                fVar134 = aVar59.v[0];
                fVar137 = aVar59.v[1];
                fVar139 = aVar59.v[2];
                fVar141 = aVar59.v[3];
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar39._4_4_ = -(uint)(fVar137 < tray.tfar.field_0.v[1]);
                    auVar39._0_4_ = -(uint)(fVar134 < tray.tfar.field_0.v[0]);
                    auVar39._8_4_ = -(uint)(fVar139 < tray.tfar.field_0.v[2]);
                    auVar39._12_4_ = -(uint)(fVar141 < tray.tfar.field_0.v[3]);
                    iVar16 = movmskps((int)sVar178,auVar39);
                    if (iVar16 != 0) {
                      uVar19 = (ulong)((uint)root.ptr & 0xf) - 8;
                      uVar18 = uVar19;
                      aVar88 = terminated.field_0;
                      if (uVar19 != 0) {
                        auVar85._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                        auVar85._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                        auVar85._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                        uVar18 = 0;
                        do {
                          lVar32 = uVar18 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                          uVar23 = movmskps((int)uVar18,auVar85);
                          uVar20 = CONCAT44((int)(uVar18 >> 0x20),uVar23);
                          uVar21 = uVar20;
                          uVar31 = 0;
                          auVar93 = auVar85;
                          while (*(int *)(lVar32 + 0x40 + uVar31 * 4) != -1) {
                            pRVar3 = (context->scene->geometries).items;
                            pGVar24 = pRVar3[*(uint *)(lVar32 + 0x30 + uVar31 * 4)].ptr;
                            fVar134 = pGVar24->fnumTimeSegments;
                            fVar137 = (pGVar24->time_range).lower;
                            auVar60._0_4_ = (pGVar24->time_range).upper - fVar137;
                            auVar114._0_4_ = *(float *)(ray + 0x70) - fVar137;
                            auVar114._4_4_ = *(float *)(ray + 0x74) - fVar137;
                            auVar114._8_4_ = *(float *)(ray + 0x78) - fVar137;
                            auVar114._12_4_ = *(float *)(ray + 0x7c) - fVar137;
                            auVar60._4_4_ = auVar60._0_4_;
                            auVar60._8_4_ = auVar60._0_4_;
                            auVar60._12_4_ = auVar60._0_4_;
                            auVar115 = divps(auVar114,auVar60);
                            auVar116._0_4_ = auVar115._0_4_ * fVar134;
                            auVar116._4_4_ = auVar115._4_4_ * fVar134;
                            auVar116._8_4_ = auVar115._8_4_ * fVar134;
                            auVar116._12_4_ = auVar115._12_4_ * fVar134;
                            auVar115 = roundps(auVar60,auVar116,1);
                            auVar52._0_4_ = fVar134 + -1.0;
                            auVar52._4_4_ = auVar52._0_4_;
                            auVar52._8_4_ = auVar52._0_4_;
                            auVar52._12_4_ = auVar52._0_4_;
                            auVar115 = minps(auVar115,auVar52);
                            auVar115 = maxps(auVar115,_DAT_01feba10);
                            fVar134 = auVar116._0_4_ - auVar115._0_4_;
                            fVar137 = auVar116._4_4_ - auVar115._4_4_;
                            fVar139 = auVar116._8_4_ - auVar115._8_4_;
                            fVar141 = auVar116._12_4_ - auVar115._12_4_;
                            itime.field_0.i[0] = (int)auVar115._0_4_;
                            itime.field_0.i[1] = (int)auVar115._4_4_;
                            itime.field_0.i[2] = (int)auVar115._8_4_;
                            itime.field_0.i[3] = (int)auVar115._12_4_;
                            uVar21 = 0;
                            if (uVar20 != 0) {
                              for (; (uVar20 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                              }
                            }
                            iVar16 = itime.field_0.i[uVar21];
                            auVar61._0_4_ = -(uint)(iVar16 == itime.field_0.i[0]);
                            auVar61._4_4_ = -(uint)(iVar16 == itime.field_0.i[1]);
                            auVar61._8_4_ = -(uint)(iVar16 == itime.field_0.i[2]);
                            auVar61._12_4_ = -(uint)(iVar16 == itime.field_0.i[3]);
                            uVar17 = movmskps((int)valid_i,~auVar61 & auVar85);
                            valid_i = (vint<4> *)(ulong)uVar17;
                            if (uVar17 == 0) {
                              pGVar15 = pGVar24 + 2;
                              pGVar24 = *(Geometry **)
                                         (*(long *)&pGVar15->numPrimitives + (long)iVar16 * 0x38);
                              lVar4 = *(long *)(*(long *)&pGVar15->numPrimitives + 0x38 +
                                               (long)iVar16 * 0x38);
                              uVar21 = (ulong)*(uint *)(lVar32 + uVar31 * 4);
                              uVar27 = (ulong)*(uint *)(lVar32 + 0x10 + uVar31 * 4);
                              pfVar1 = (float *)((long)&(pGVar24->super_RefCount)._vptr_RefCount +
                                                uVar21 * 4);
                              fVar49 = *pfVar1;
                              fVar79 = pfVar1[1];
                              fVar89 = pfVar1[2];
                              pfVar1 = (float *)(lVar4 + uVar21 * 4);
                              fVar72 = *pfVar1;
                              fVar80 = pfVar1[1];
                              fVar83 = pfVar1[2];
                              fVar162 = fVar162 - fVar134;
                              fVar166 = fVar166 - fVar137;
                              fVar170 = fVar170 - fVar139;
                              fVar174 = fVar174 - fVar141;
                              fVar67 = fVar49 * fVar162 + fVar72 * fVar134;
                              fVar68 = fVar49 * fVar166 + fVar72 * fVar137;
                              fVar70 = fVar49 * fVar170 + fVar72 * fVar139;
                              fVar76 = fVar49 * fVar174 + fVar72 * fVar141;
                              fVar49 = fVar79 * fVar162 + fVar80 * fVar134;
                              fVar72 = fVar79 * fVar166 + fVar80 * fVar137;
                              fVar84 = fVar79 * fVar170 + fVar80 * fVar139;
                              fVar79 = fVar79 * fVar174 + fVar80 * fVar141;
                              fVar78 = fVar89 * fVar162 + fVar83 * fVar134;
                              fVar81 = fVar89 * fVar166 + fVar83 * fVar137;
                              fVar82 = fVar89 * fVar170 + fVar83 * fVar139;
                              fVar92 = fVar89 * fVar174 + fVar83 * fVar141;
                              pfVar1 = (float *)((long)&(pGVar24->super_RefCount)._vptr_RefCount +
                                                uVar27 * 4);
                              fVar89 = *pfVar1;
                              fVar80 = pfVar1[1];
                              fVar83 = pfVar1[2];
                              pfVar1 = (float *)(lVar4 + uVar27 * 4);
                              fVar90 = *pfVar1;
                              fVar91 = pfVar1[1];
                              fVar107 = pfVar1[2];
                              fVar103 = fVar89 * fVar162 + fVar90 * fVar134;
                              fVar105 = fVar89 * fVar166 + fVar90 * fVar137;
                              fVar69 = fVar89 * fVar170 + fVar90 * fVar139;
                              fVar71 = fVar89 * fVar174 + fVar90 * fVar141;
                              fVar163 = fVar80 * fVar162 + fVar91 * fVar134;
                              fVar167 = fVar80 * fVar166 + fVar91 * fVar137;
                              fVar171 = fVar80 * fVar170 + fVar91 * fVar139;
                              fVar175 = fVar80 * fVar174 + fVar91 * fVar141;
                              fVar97 = fVar83 * fVar162 + fVar107 * fVar134;
                              fVar98 = fVar83 * fVar166 + fVar107 * fVar137;
                              fVar99 = fVar83 * fVar170 + fVar107 * fVar139;
                              fVar100 = fVar83 * fVar174 + fVar107 * fVar141;
                              valid_i = (vint<4> *)(ulong)*(uint *)(lVar32 + 0x20 + uVar31 * 4);
                              pfVar1 = (float *)(lVar4 + (long)valid_i * 4);
                              fVar90 = *pfVar1;
                              fVar150 = pfVar1[1];
                              fVar35 = pfVar1[2];
                              pfVar1 = (float *)((long)&(pGVar24->super_RefCount)._vptr_RefCount +
                                                (long)valid_i * 4);
                              fVar91 = *pfVar1;
                              fVar47 = pfVar1[1];
                              fVar48 = pfVar1[2];
                              fVar89 = fVar91 * fVar162 + fVar90 * fVar134;
                              fVar80 = fVar91 * fVar166 + fVar90 * fVar137;
                              fVar83 = fVar91 * fVar170 + fVar90 * fVar139;
                              fVar90 = fVar91 * fVar174 + fVar90 * fVar141;
                              fVar91 = fVar47 * fVar162 + fVar150 * fVar134;
                              fVar107 = fVar47 * fVar166 + fVar150 * fVar137;
                              fVar149 = fVar47 * fVar170 + fVar150 * fVar139;
                              fVar150 = fVar47 * fVar174 + fVar150 * fVar141;
                              fVar162 = fVar48 * fVar162 + fVar35 * fVar134;
                              fVar166 = fVar48 * fVar166 + fVar35 * fVar137;
                              fVar170 = fVar48 * fVar170 + fVar35 * fVar139;
                              fVar174 = fVar48 * fVar174 + fVar35 * fVar141;
                            }
                            else {
                              if (uVar20 != 0) {
                                lVar4 = *(long *)&pGVar24[2].numPrimitives;
                                valid_i = (vint<4> *)(lVar4 + 0x38);
                                uVar26 = (ulong)*(uint *)(lVar32 + uVar31 * 4);
                                uVar28 = uVar20;
                                uVar27 = uVar21;
                                do {
                                  auVar115 = *(undefined1 (*) [16])
                                              (*(long *)(lVar4 + (long)itime.field_0.i[uVar27] *
                                                                 0x38) + uVar26 * 4);
                                  auVar146 = *(undefined1 (*) [16])
                                              ((long)&((&((Intersectors *)valid_i)->ptr)
                                                       [(long)itime.field_0.i[uVar27] * 7]->
                                                      super_RefCount)._vptr_RefCount + uVar26 * 4);
                                  *(int *)((long)&p0.field_0 + uVar27 * 4) = auVar115._0_4_;
                                  uVar22 = extractps(auVar115,1);
                                  *(undefined8 *)((long)&p0.field_0 + uVar27 * 4 + 0x10) = uVar22;
                                  uVar22 = extractps(auVar115,2);
                                  *(undefined8 *)((long)&p0.field_0 + uVar27 * 4 + 0x20) = uVar22;
                                  *(int *)((long)&p1.field_0 + uVar27 * 4) = auVar146._0_4_;
                                  uVar22 = extractps(auVar146,1);
                                  *(undefined8 *)((long)&p1.field_0 + uVar27 * 4 + 0x10) = uVar22;
                                  uVar22 = extractps(auVar146,2);
                                  *(undefined8 *)((long)&p1.field_0 + uVar27 * 4 + 0x20) = uVar22;
                                  uVar28 = uVar28 ^ 1L << (uVar27 & 0x3f);
                                  uVar27 = 0;
                                  if (uVar28 != 0) {
                                    for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                                    }
                                  }
                                } while (uVar28 != 0);
                              }
                              fVar162 = fVar162 - fVar134;
                              fVar166 = fVar166 - fVar137;
                              fVar170 = fVar170 - fVar139;
                              fVar174 = fVar174 - fVar141;
                              fVar67 = (float)p0.field_0._0_4_ * fVar162;
                              fVar68 = (float)p0.field_0._4_4_ * fVar166;
                              fVar70 = (float)p0.field_0._8_4_ * fVar170;
                              fVar76 = (float)p0.field_0._12_4_ * fVar174;
                              fVar49 = (float)p0.field_0._16_4_ * fVar162;
                              fVar72 = (float)p0.field_0._20_4_ * fVar166;
                              fVar84 = (float)p0.field_0._24_4_ * fVar170;
                              fVar79 = (float)p0.field_0._28_4_ * fVar174;
                              fVar78 = (float)p0.field_0._32_4_ * fVar162;
                              fVar81 = (float)p0.field_0._36_4_ * fVar166;
                              fVar82 = (float)p0.field_0._40_4_ * fVar170;
                              fVar92 = (float)p0.field_0._44_4_ * fVar174;
                              fVar89 = (float)p1.field_0._0_4_ * fVar134;
                              fVar80 = (float)p1.field_0._4_4_ * fVar137;
                              fVar83 = (float)p1.field_0._8_4_ * fVar139;
                              fVar90 = (float)p1.field_0._12_4_ * fVar141;
                              fVar91 = (float)p1.field_0._16_4_ * fVar134;
                              fVar107 = (float)p1.field_0._20_4_ * fVar137;
                              fVar149 = (float)p1.field_0._24_4_ * fVar139;
                              fVar150 = (float)p1.field_0._28_4_ * fVar141;
                              fVar35 = (float)p1.field_0._32_4_ * fVar134;
                              fVar47 = (float)p1.field_0._36_4_ * fVar137;
                              fVar48 = (float)p1.field_0._40_4_ * fVar139;
                              fVar57 = (float)p1.field_0._44_4_ * fVar141;
                              if (uVar20 != 0) {
                                lVar4 = *(long *)&pGVar24[2].numPrimitives;
                                valid_i = (vint<4> *)(lVar4 + 0x38);
                                uVar26 = (ulong)*(uint *)(lVar32 + 0x10 + uVar31 * 4);
                                uVar28 = uVar20;
                                uVar27 = uVar21;
                                do {
                                  auVar115 = *(undefined1 (*) [16])
                                              (*(long *)(lVar4 + (long)itime.field_0.i[uVar27] *
                                                                 0x38) + uVar26 * 4);
                                  auVar146 = *(undefined1 (*) [16])
                                              ((long)&((&((Intersectors *)valid_i)->ptr)
                                                       [(long)itime.field_0.i[uVar27] * 7]->
                                                      super_RefCount)._vptr_RefCount + uVar26 * 4);
                                  *(int *)((long)&p0.field_0 + uVar27 * 4) = auVar115._0_4_;
                                  uVar22 = extractps(auVar115,1);
                                  *(undefined8 *)((long)&p0.field_0 + uVar27 * 4 + 0x10) = uVar22;
                                  uVar22 = extractps(auVar115,2);
                                  *(undefined8 *)((long)&p0.field_0 + uVar27 * 4 + 0x20) = uVar22;
                                  *(int *)((long)&p1.field_0 + uVar27 * 4) = auVar146._0_4_;
                                  uVar22 = extractps(auVar146,1);
                                  *(undefined8 *)((long)&p1.field_0 + uVar27 * 4 + 0x10) = uVar22;
                                  uVar22 = extractps(auVar146,2);
                                  *(undefined8 *)((long)&p1.field_0 + uVar27 * 4 + 0x20) = uVar22;
                                  uVar28 = uVar28 ^ 1L << (uVar27 & 0x3f);
                                  uVar27 = 0;
                                  if (uVar28 != 0) {
                                    for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                                    }
                                  }
                                } while (uVar28 != 0);
                              }
                              fVar103 = (float)p0.field_0._0_4_ * fVar162;
                              fVar105 = (float)p0.field_0._4_4_ * fVar166;
                              fVar69 = (float)p0.field_0._8_4_ * fVar170;
                              fVar71 = (float)p0.field_0._12_4_ * fVar174;
                              fVar163 = (float)p0.field_0._16_4_ * fVar162;
                              fVar167 = (float)p0.field_0._20_4_ * fVar166;
                              fVar171 = (float)p0.field_0._24_4_ * fVar170;
                              fVar175 = (float)p0.field_0._28_4_ * fVar174;
                              fVar97 = (float)p0.field_0._32_4_ * fVar162;
                              fVar98 = (float)p0.field_0._36_4_ * fVar166;
                              fVar99 = (float)p0.field_0._40_4_ * fVar170;
                              fVar100 = (float)p0.field_0._44_4_ * fVar174;
                              fVar50 = (float)p1.field_0._0_4_ * fVar134;
                              fVar73 = (float)p1.field_0._4_4_ * fVar137;
                              fVar77 = (float)p1.field_0._8_4_ * fVar139;
                              fVar101 = (float)p1.field_0._12_4_ * fVar141;
                              fVar111 = (float)p1.field_0._16_4_ * fVar134;
                              fVar121 = (float)p1.field_0._20_4_ * fVar137;
                              fVar123 = (float)p1.field_0._24_4_ * fVar139;
                              fVar125 = (float)p1.field_0._28_4_ * fVar141;
                              fVar104 = (float)p1.field_0._32_4_ * fVar134;
                              fVar106 = (float)p1.field_0._36_4_ * fVar137;
                              fVar108 = (float)p1.field_0._40_4_ * fVar139;
                              fVar110 = (float)p1.field_0._44_4_ * fVar141;
                              if (uVar20 != 0) {
                                pGVar24 = *(Geometry **)&pGVar24[2].numPrimitives;
                                valid_i = (vint<4> *)(ulong)*(uint *)(lVar32 + 0x20 + uVar31 * 4);
                                uVar27 = uVar20;
                                do {
                                  auVar115 = *(undefined1 (*) [16])
                                              (*(long *)((long)&pGVar24->super_RefCount +
                                                        (long)itime.field_0.i[uVar21] * 0x38) +
                                              (long)valid_i * 4);
                                  auVar146 = *(undefined1 (*) [16])
                                              (*(long *)(&pGVar24->modCounter_ +
                                                        (long)itime.field_0.i[uVar21] * 0xe) +
                                              (long)valid_i * 4);
                                  *(int *)((long)&p0.field_0 + uVar21 * 4) = auVar115._0_4_;
                                  uVar22 = extractps(auVar115,1);
                                  *(undefined8 *)((long)&p0.field_0 + uVar21 * 4 + 0x10) = uVar22;
                                  uVar22 = extractps(auVar115,2);
                                  *(undefined8 *)((long)&p0.field_0 + uVar21 * 4 + 0x20) = uVar22;
                                  *(int *)((long)&p1.field_0 + uVar21 * 4) = auVar146._0_4_;
                                  uVar22 = extractps(auVar146,1);
                                  *(undefined8 *)((long)&p1.field_0 + uVar21 * 4 + 0x10) = uVar22;
                                  uVar22 = extractps(auVar146,2);
                                  *(undefined8 *)((long)&p1.field_0 + uVar21 * 4 + 0x20) = uVar22;
                                  uVar27 = uVar27 ^ 1L << (uVar21 & 0x3f);
                                  uVar21 = 0;
                                  if (uVar27 != 0) {
                                    for (; (uVar27 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                    }
                                  }
                                } while (uVar27 != 0);
                              }
                              fVar67 = fVar67 + fVar89;
                              fVar68 = fVar68 + fVar80;
                              fVar70 = fVar70 + fVar83;
                              fVar76 = fVar76 + fVar90;
                              fVar49 = fVar49 + fVar91;
                              fVar72 = fVar72 + fVar107;
                              fVar84 = fVar84 + fVar149;
                              fVar79 = fVar79 + fVar150;
                              fVar78 = fVar78 + fVar35;
                              fVar81 = fVar81 + fVar47;
                              fVar82 = fVar82 + fVar48;
                              fVar92 = fVar92 + fVar57;
                              fVar103 = fVar103 + fVar50;
                              fVar105 = fVar105 + fVar73;
                              fVar69 = fVar69 + fVar77;
                              fVar71 = fVar71 + fVar101;
                              fVar163 = fVar163 + fVar111;
                              fVar167 = fVar167 + fVar121;
                              fVar171 = fVar171 + fVar123;
                              fVar175 = fVar175 + fVar125;
                              fVar97 = fVar97 + fVar104;
                              fVar98 = fVar98 + fVar106;
                              fVar99 = fVar99 + fVar108;
                              fVar100 = fVar100 + fVar110;
                              fVar89 = (float)p1.field_0._0_4_ * fVar134 +
                                       (float)p0.field_0._0_4_ * fVar162;
                              fVar80 = (float)p1.field_0._4_4_ * fVar137 +
                                       (float)p0.field_0._4_4_ * fVar166;
                              fVar83 = (float)p1.field_0._8_4_ * fVar139 +
                                       (float)p0.field_0._8_4_ * fVar170;
                              fVar90 = (float)p1.field_0._12_4_ * fVar141 +
                                       (float)p0.field_0._12_4_ * fVar174;
                              fVar91 = (float)p1.field_0._16_4_ * fVar134 +
                                       (float)p0.field_0._16_4_ * fVar162;
                              fVar107 = (float)p1.field_0._20_4_ * fVar137 +
                                        (float)p0.field_0._20_4_ * fVar166;
                              fVar149 = (float)p1.field_0._24_4_ * fVar139 +
                                        (float)p0.field_0._24_4_ * fVar170;
                              fVar150 = (float)p1.field_0._28_4_ * fVar141 +
                                        (float)p0.field_0._28_4_ * fVar174;
                              fVar162 = fVar134 * (float)p1.field_0._32_4_ +
                                        fVar162 * (float)p0.field_0._32_4_;
                              fVar166 = fVar137 * (float)p1.field_0._36_4_ +
                                        fVar166 * (float)p0.field_0._36_4_;
                              fVar170 = fVar139 * (float)p1.field_0._40_4_ +
                                        fVar170 * (float)p0.field_0._40_4_;
                              fVar174 = fVar141 * (float)p1.field_0._44_4_ +
                                        fVar174 * (float)p0.field_0._44_4_;
                            }
                            local_16e8 = *(undefined8 *)(lVar32 + 0x30);
                            uStack_16e0 = *(undefined8 *)(lVar32 + 0x38);
                            local_16f8 = *(undefined8 *)(lVar32 + 0x40);
                            uStack_16f0 = *(undefined8 *)(lVar32 + 0x48);
                            fVar134 = *(float *)ray;
                            fVar137 = *(float *)(ray + 4);
                            fVar139 = *(float *)(ray + 8);
                            fVar141 = *(float *)(ray + 0xc);
                            fVar35 = *(float *)(ray + 0x10);
                            fVar47 = *(float *)(ray + 0x14);
                            fVar48 = *(float *)(ray + 0x18);
                            fVar57 = *(float *)(ray + 0x1c);
                            fVar50 = *(float *)(ray + 0x20);
                            fVar73 = *(float *)(ray + 0x24);
                            fVar77 = *(float *)(ray + 0x28);
                            fVar101 = *(float *)(ray + 0x2c);
                            fVar111 = *(float *)(ray + 0x40);
                            fVar121 = *(float *)(ray + 0x44);
                            fVar123 = *(float *)(ray + 0x48);
                            fVar125 = *(float *)(ray + 0x4c);
                            fVar67 = fVar67 - fVar134;
                            fVar68 = fVar68 - fVar137;
                            fVar70 = fVar70 - fVar139;
                            fVar76 = fVar76 - fVar141;
                            fVar49 = fVar49 - fVar35;
                            fVar72 = fVar72 - fVar47;
                            fVar84 = fVar84 - fVar48;
                            fVar79 = fVar79 - fVar57;
                            fVar78 = fVar78 - fVar50;
                            fVar81 = fVar81 - fVar73;
                            fVar82 = fVar82 - fVar77;
                            fVar92 = fVar92 - fVar101;
                            fVar103 = fVar103 - fVar134;
                            fVar105 = fVar105 - fVar137;
                            fVar69 = fVar69 - fVar139;
                            fVar71 = fVar71 - fVar141;
                            fVar163 = fVar163 - fVar35;
                            fVar167 = fVar167 - fVar47;
                            fVar171 = fVar171 - fVar48;
                            fVar175 = fVar175 - fVar57;
                            fVar97 = fVar97 - fVar50;
                            fVar98 = fVar98 - fVar73;
                            fVar99 = fVar99 - fVar77;
                            fVar100 = fVar100 - fVar101;
                            fVar89 = fVar89 - fVar134;
                            fVar80 = fVar80 - fVar137;
                            fVar83 = fVar83 - fVar139;
                            fVar90 = fVar90 - fVar141;
                            fVar91 = fVar91 - fVar35;
                            fVar107 = fVar107 - fVar47;
                            fVar149 = fVar149 - fVar48;
                            fVar150 = fVar150 - fVar57;
                            fVar162 = fVar162 - fVar50;
                            fVar166 = fVar166 - fVar73;
                            fVar170 = fVar170 - fVar77;
                            fVar174 = fVar174 - fVar101;
                            fVar151 = fVar89 - fVar67;
                            fVar156 = fVar80 - fVar68;
                            fVar158 = fVar83 - fVar70;
                            fVar160 = fVar90 - fVar76;
                            fVar164 = fVar91 - fVar49;
                            fVar168 = fVar107 - fVar72;
                            fVar172 = fVar149 - fVar84;
                            fVar176 = fVar150 - fVar79;
                            fVar137 = fVar162 - fVar78;
                            fVar141 = fVar166 - fVar81;
                            fVar47 = fVar170 - fVar82;
                            fVar57 = fVar174 - fVar92;
                            auVar14 = *(undefined1 (*) [12])(ray + 0x60);
                            fVar134 = *(float *)(ray + 0x6c);
                            fVar152 = fVar67 - fVar103;
                            fVar157 = fVar68 - fVar105;
                            fVar159 = fVar70 - fVar69;
                            fVar161 = fVar76 - fVar71;
                            local_18f8 = (float)*(undefined8 *)(ray + 0x50);
                            fStack_18f4 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
                            fStack_18f0 = (float)*(undefined8 *)(ray + 0x58);
                            fStack_18ec = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                            fVar135 = fVar49 - fVar163;
                            fVar138 = fVar72 - fVar167;
                            fVar140 = fVar84 - fVar171;
                            fVar142 = fVar79 - fVar175;
                            fVar110 = (fVar164 * (fVar162 + fVar78) - (fVar91 + fVar49) * fVar137) *
                                      fVar111 + ((fVar89 + fVar67) * fVar137 -
                                                (fVar162 + fVar78) * fVar151) * local_18f8 +
                                                (fVar151 * (fVar91 + fVar49) -
                                                (fVar89 + fVar67) * fVar164) *
                                                *(float *)(ray + 0x60);
                            fVar120 = (fVar168 * (fVar166 + fVar81) - (fVar107 + fVar72) * fVar141)
                                      * fVar121 +
                                      ((fVar80 + fVar68) * fVar141 - (fVar166 + fVar81) * fVar156) *
                                      fStack_18f4 +
                                      (fVar156 * (fVar107 + fVar72) - (fVar80 + fVar68) * fVar168) *
                                      *(float *)(ray + 100);
                            auVar117._0_8_ = CONCAT44(fVar120,fVar110);
                            auVar117._8_4_ =
                                 (fVar172 * (fVar170 + fVar82) - (fVar149 + fVar84) * fVar47) *
                                 fVar123 + ((fVar83 + fVar70) * fVar47 -
                                           (fVar170 + fVar82) * fVar158) * fStack_18f0 +
                                           (fVar158 * (fVar149 + fVar84) -
                                           (fVar83 + fVar70) * fVar172) * *(float *)(ray + 0x68);
                            auVar117._12_4_ =
                                 (fVar176 * (fVar174 + fVar92) - (fVar150 + fVar79) * fVar57) *
                                 fVar125 + ((fVar90 + fVar76) * fVar57 -
                                           (fVar174 + fVar92) * fVar160) * fStack_18ec +
                                           (fVar160 * (fVar150 + fVar79) -
                                           (fVar90 + fVar76) * fVar176) * fVar134;
                            fVar139 = fVar78 - fVar97;
                            fVar35 = fVar81 - fVar98;
                            fVar48 = fVar82 - fVar99;
                            fVar50 = fVar92 - fVar100;
                            local_1a38 = auVar14._0_4_;
                            fStack_1a34 = auVar14._4_4_;
                            fStack_1a30 = auVar14._8_4_;
                            fVar73 = (fVar135 * (fVar78 + fVar97) - (fVar49 + fVar163) * fVar139) *
                                     fVar111 + ((fVar67 + fVar103) * fVar139 -
                                               (fVar78 + fVar97) * fVar152) * local_18f8 +
                                               (fVar152 * (fVar49 + fVar163) -
                                               (fVar67 + fVar103) * fVar135) * local_1a38;
                            fVar77 = (fVar138 * (fVar81 + fVar98) - (fVar72 + fVar167) * fVar35) *
                                     fVar121 + ((fVar68 + fVar105) * fVar35 -
                                               (fVar81 + fVar98) * fVar157) * fStack_18f4 +
                                               (fVar157 * (fVar72 + fVar167) -
                                               (fVar68 + fVar105) * fVar138) * fStack_1a34;
                            auVar75._0_8_ = CONCAT44(fVar77,fVar73);
                            auVar75._8_4_ =
                                 (fVar140 * (fVar82 + fVar99) - (fVar84 + fVar171) * fVar48) *
                                 fVar123 + ((fVar70 + fVar69) * fVar48 - (fVar82 + fVar99) * fVar159
                                           ) * fStack_18f0 +
                                           (fVar159 * (fVar84 + fVar171) -
                                           (fVar70 + fVar69) * fVar140) * fStack_1a30;
                            auVar75._12_4_ =
                                 (fVar142 * (fVar92 + fVar100) - (fVar79 + fVar175) * fVar50) *
                                 fVar125 + ((fVar76 + fVar71) * fVar50 -
                                           (fVar92 + fVar100) * fVar161) * fStack_18ec +
                                           (fVar161 * (fVar79 + fVar175) -
                                           (fVar76 + fVar71) * fVar142) * fVar134;
                            fVar101 = fVar103 - fVar89;
                            fVar104 = fVar105 - fVar80;
                            fVar106 = fVar69 - fVar83;
                            fVar108 = fVar71 - fVar90;
                            fVar165 = fVar163 - fVar91;
                            fVar169 = fVar167 - fVar107;
                            fVar173 = fVar171 - fVar149;
                            fVar177 = fVar175 - fVar150;
                            fVar130 = fVar97 - fVar162;
                            fVar131 = fVar98 - fVar166;
                            fVar132 = fVar99 - fVar170;
                            fVar133 = fVar100 - fVar174;
                            auVar53._0_4_ =
                                 (fVar165 * (fVar162 + fVar97) - (fVar91 + fVar163) * fVar130) *
                                 fVar111 + ((fVar89 + fVar103) * fVar130 -
                                           (fVar162 + fVar97) * fVar101) * local_18f8 +
                                           (fVar101 * (fVar91 + fVar163) -
                                           (fVar89 + fVar103) * fVar165) * local_1a38;
                            auVar53._4_4_ =
                                 (fVar169 * (fVar166 + fVar98) - (fVar107 + fVar167) * fVar131) *
                                 fVar121 + ((fVar80 + fVar105) * fVar131 -
                                           (fVar166 + fVar98) * fVar104) * fStack_18f4 +
                                           (fVar104 * (fVar107 + fVar167) -
                                           (fVar80 + fVar105) * fVar169) * fStack_1a34;
                            auVar53._8_4_ =
                                 (fVar173 * (fVar170 + fVar99) - (fVar149 + fVar171) * fVar132) *
                                 fVar123 + ((fVar83 + fVar69) * fVar132 -
                                           (fVar170 + fVar99) * fVar106) * fStack_18f0 +
                                           (fVar106 * (fVar149 + fVar171) -
                                           (fVar83 + fVar69) * fVar173) * fStack_1a30;
                            auVar53._12_4_ =
                                 (fVar177 * (fVar174 + fVar100) - (fVar150 + fVar175) * fVar133) *
                                 fVar125 + ((fVar90 + fVar71) * fVar133 -
                                           (fVar174 + fVar100) * fVar108) * fStack_18ec +
                                           (fVar108 * (fVar150 + fVar175) -
                                           (fVar90 + fVar71) * fVar177) * fVar134;
                            fVar162 = fVar110 + fVar73 + auVar53._0_4_;
                            fVar166 = fVar120 + fVar77 + auVar53._4_4_;
                            auVar62._0_8_ = CONCAT44(fVar166,fVar162);
                            auVar62._8_4_ = auVar117._8_4_ + auVar75._8_4_ + auVar53._8_4_;
                            auVar62._12_4_ = auVar117._12_4_ + auVar75._12_4_ + auVar53._12_4_;
                            auVar40._8_4_ = auVar117._8_4_;
                            auVar40._0_8_ = auVar117._0_8_;
                            auVar40._12_4_ = auVar117._12_4_;
                            auVar115 = minps(auVar40,auVar75);
                            auVar115 = minps(auVar115,auVar53);
                            auVar145._8_4_ = auVar117._8_4_;
                            auVar145._0_8_ = auVar117._0_8_;
                            auVar145._12_4_ = auVar117._12_4_;
                            auVar146 = maxps(auVar145,auVar75);
                            auVar146 = maxps(auVar146,auVar53);
                            fVar162 = ABS(fVar162) * 1.1920929e-07;
                            fVar166 = ABS(fVar166) * 1.1920929e-07;
                            local_19a8 = auVar93._0_4_;
                            uStack_19a4 = auVar93._4_4_;
                            uStack_19a0 = auVar93._8_4_;
                            uStack_199c = auVar93._12_4_;
                            auVar147._0_8_ =
                                 CONCAT44(-(uint)(auVar146._4_4_ <= fVar166 ||
                                                 -fVar166 <= auVar115._4_4_) & uStack_19a4,
                                          -(uint)(auVar146._0_4_ <= fVar162 ||
                                                 -fVar162 <= auVar115._0_4_) & local_19a8);
                            auVar147._8_4_ =
                                 -(uint)(auVar146._8_4_ <= ABS(auVar62._8_4_) * 1.1920929e-07 ||
                                        -(ABS(auVar62._8_4_) * 1.1920929e-07) <= auVar115._8_4_) &
                                 uStack_19a0;
                            auVar147._12_4_ =
                                 -(uint)(auVar146._12_4_ <= ABS(auVar62._12_4_) * 1.1920929e-07 ||
                                        -(ABS(auVar62._12_4_) * 1.1920929e-07) <= auVar115._12_4_) &
                                 uStack_199c;
                            iVar16 = movmskps((int)pGVar24,auVar147);
                            if (iVar16 == 0) {
                              auVar96._8_4_ = auVar147._8_4_;
                              auVar96._0_8_ = auVar147._0_8_;
                              auVar96._12_4_ = auVar147._12_4_;
                              auVar63 = auVar62;
                            }
                            else {
                              auVar86._0_4_ = fVar164 * fVar139 - fVar135 * fVar137;
                              auVar86._4_4_ = fVar168 * fVar35 - fVar138 * fVar141;
                              auVar86._8_4_ = fVar172 * fVar48 - fVar140 * fVar47;
                              auVar86._12_4_ = fVar176 * fVar50 - fVar142 * fVar57;
                              auVar136._0_4_ = fVar135 * fVar130 - fVar165 * fVar139;
                              auVar136._4_4_ = fVar138 * fVar131 - fVar169 * fVar35;
                              auVar136._8_4_ = fVar140 * fVar132 - fVar173 * fVar48;
                              auVar136._12_4_ = fVar142 * fVar133 - fVar177 * fVar50;
                              auVar41._4_4_ =
                                   -(uint)(ABS(fVar138 * fVar141) < ABS(fVar169 * fVar35));
                              auVar41._0_4_ =
                                   -(uint)(ABS(fVar135 * fVar137) < ABS(fVar165 * fVar139));
                              auVar41._8_4_ = -(uint)(ABS(fVar140 * fVar47) < ABS(fVar173 * fVar48))
                              ;
                              auVar41._12_4_ =
                                   -(uint)(ABS(fVar142 * fVar57) < ABS(fVar177 * fVar50));
                              auVar58 = blendvps(auVar136,auVar86,auVar41);
                              auVar102._0_4_ = fVar101 * fVar139 - fVar152 * fVar130;
                              auVar102._4_4_ = fVar104 * fVar35 - fVar157 * fVar131;
                              auVar102._8_4_ = fVar106 * fVar48 - fVar159 * fVar132;
                              auVar102._12_4_ = fVar108 * fVar50 - fVar161 * fVar133;
                              auVar42._4_4_ =
                                   -(uint)(ABS(fVar156 * fVar35) < ABS(fVar157 * fVar131));
                              auVar42._0_4_ =
                                   -(uint)(ABS(fVar151 * fVar139) < ABS(fVar152 * fVar130));
                              auVar42._8_4_ =
                                   -(uint)(ABS(fVar158 * fVar48) < ABS(fVar159 * fVar132));
                              auVar42._12_4_ =
                                   -(uint)(ABS(fVar160 * fVar50) < ABS(fVar161 * fVar133));
                              auVar9._4_4_ = fVar141 * fVar157 - fVar156 * fVar35;
                              auVar9._0_4_ = fVar137 * fVar152 - fVar151 * fVar139;
                              auVar9._8_4_ = fVar47 * fVar159 - fVar158 * fVar48;
                              auVar9._12_4_ = fVar57 * fVar161 - fVar160 * fVar50;
                              auVar146 = blendvps(auVar102,auVar9,auVar42);
                              auVar118._0_4_ = fVar151 * fVar135 - fVar152 * fVar164;
                              auVar118._4_4_ = fVar156 * fVar138 - fVar157 * fVar168;
                              auVar118._8_4_ = fVar158 * fVar140 - fVar159 * fVar172;
                              auVar118._12_4_ = fVar160 * fVar142 - fVar161 * fVar176;
                              auVar154._0_4_ = fVar152 * fVar165 - fVar101 * fVar135;
                              auVar154._4_4_ = fVar157 * fVar169 - fVar104 * fVar138;
                              auVar154._8_4_ = fVar159 * fVar173 - fVar106 * fVar140;
                              auVar154._12_4_ = fVar161 * fVar177 - fVar108 * fVar142;
                              auVar43._4_4_ =
                                   -(uint)(ABS(fVar157 * fVar168) < ABS(fVar104 * fVar138));
                              auVar43._0_4_ =
                                   -(uint)(ABS(fVar152 * fVar164) < ABS(fVar101 * fVar135));
                              auVar43._8_4_ =
                                   -(uint)(ABS(fVar159 * fVar172) < ABS(fVar106 * fVar140));
                              auVar43._12_4_ =
                                   -(uint)(ABS(fVar161 * fVar176) < ABS(fVar108 * fVar142));
                              auVar155 = blendvps(auVar154,auVar118,auVar43);
                              fVar162 = fVar111 * auVar58._0_4_ +
                                        local_18f8 * auVar146._0_4_ + local_1a38 * auVar155._0_4_;
                              fVar166 = fVar121 * auVar58._4_4_ +
                                        fStack_18f4 * auVar146._4_4_ + fStack_1a34 * auVar155._4_4_;
                              fVar170 = fVar123 * auVar58._8_4_ +
                                        fStack_18f0 * auVar146._8_4_ + fStack_1a30 * auVar155._8_4_;
                              fVar174 = fVar125 * auVar58._12_4_ +
                                        fStack_18ec * auVar146._12_4_ + fVar134 * auVar155._12_4_;
                              auVar94._0_4_ = fVar162 + fVar162;
                              auVar94._4_4_ = fVar166 + fVar166;
                              auVar94._8_4_ = fVar170 + fVar170;
                              auVar94._12_4_ = fVar174 + fVar174;
                              auVar54._0_4_ = fVar78 * auVar155._0_4_;
                              auVar54._4_4_ = fVar81 * auVar155._4_4_;
                              auVar54._8_4_ = fVar82 * auVar155._8_4_;
                              auVar54._12_4_ = fVar92 * auVar155._12_4_;
                              fVar134 = fVar67 * auVar58._0_4_ +
                                        fVar49 * auVar146._0_4_ + auVar54._0_4_;
                              fVar137 = fVar68 * auVar58._4_4_ +
                                        fVar72 * auVar146._4_4_ + auVar54._4_4_;
                              fVar139 = fVar70 * auVar58._8_4_ +
                                        fVar84 * auVar146._8_4_ + auVar54._8_4_;
                              fVar141 = fVar76 * auVar58._12_4_ +
                                        fVar79 * auVar146._12_4_ + auVar54._12_4_;
                              auVar115 = rcpps(auVar54,auVar94);
                              fVar162 = auVar115._0_4_;
                              fVar166 = auVar115._4_4_;
                              fVar170 = auVar115._8_4_;
                              fVar174 = auVar115._12_4_;
                              fVar162 = ((1.0 - auVar94._0_4_ * fVar162) * fVar162 + fVar162) *
                                        (fVar134 + fVar134);
                              fVar166 = ((1.0 - auVar94._4_4_ * fVar166) * fVar166 + fVar166) *
                                        (fVar137 + fVar137);
                              fVar170 = ((1.0 - auVar94._8_4_ * fVar170) * fVar170 + fVar170) *
                                        (fVar139 + fVar139);
                              fVar174 = ((1.0 - auVar94._12_4_ * fVar174) * fVar174 + fVar174) *
                                        (fVar141 + fVar141);
                              bVar7 = fVar162 <= *(float *)(ray + 0x80) &&
                                      *(float *)(ray + 0x30) <= fVar162;
                              auVar63._0_4_ = -(uint)bVar7;
                              bVar8 = fVar166 <= *(float *)(ray + 0x84) &&
                                      *(float *)(ray + 0x34) <= fVar166;
                              auVar63._4_4_ = -(uint)bVar8;
                              bVar6 = fVar170 <= *(float *)(ray + 0x88) &&
                                      *(float *)(ray + 0x38) <= fVar170;
                              auVar63._8_4_ = -(uint)bVar6;
                              bVar34 = fVar174 <= *(float *)(ray + 0x8c) &&
                                       *(float *)(ray + 0x3c) <= fVar174;
                              auVar63._12_4_ = -(uint)bVar34;
                              auVar95._0_4_ =
                                   (int)((uint)(auVar94._0_4_ != 0.0 && bVar7) * -0x80000000) >>
                                   0x1f;
                              auVar95._4_4_ =
                                   (int)((uint)(auVar94._4_4_ != 0.0 && bVar8) * -0x80000000) >>
                                   0x1f;
                              auVar95._8_4_ =
                                   (int)((uint)(auVar94._8_4_ != 0.0 && bVar6) * -0x80000000) >>
                                   0x1f;
                              auVar95._12_4_ =
                                   (int)((uint)(auVar94._12_4_ != 0.0 && bVar34) * -0x80000000) >>
                                   0x1f;
                              auVar96 = auVar95 & auVar147;
                              iVar16 = movmskps(iVar16,auVar96);
                              if (iVar16 != 0) {
                                pcStack_19b0 = auVar117._8_8_;
                                uStack_17a0 = pcStack_19b0;
                                uStack_1790 = auVar75._8_8_;
                                uStack_17b0 = uStack_1790;
                                uStack_1780 = auVar62._8_8_;
                                uStack_17c0 = uStack_1780;
                                local_1808 = auVar155;
                                local_17f8 = auVar146;
                                local_17e8 = auVar58;
                                local_17d8 = fVar162;
                                fStack_17d4 = fVar166;
                                fStack_17d0 = fVar170;
                                fStack_17cc = fVar174;
                                local_17c8 = auVar62._0_8_;
                                local_17b8 = auVar75._0_8_;
                                local_17a8 = auVar117._0_8_;
                              }
                            }
                            pGVar24 = pRVar3[*(uint *)((long)&local_16e8 + uVar31 * 4)].ptr;
                            uVar17 = pGVar24->mask;
                            auVar55._0_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x90)) == 0);
                            auVar55._4_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x94)) == 0);
                            auVar55._8_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x98)) == 0);
                            auVar55._12_4_ = -(uint)((uVar17 & *(uint *)(ray + 0x9c)) == 0);
                            aVar56 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                     (~auVar55 & auVar96);
                            iVar16 = movmskps((int)pRVar3,(undefined1  [16])aVar56);
                            if (iVar16 == 0) {
                              uVar23 = 0;
                            }
                            else {
                              uVar23 = *(undefined4 *)((long)&local_16f8 + uVar31 * 4);
                              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                 (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar13._8_8_ = uStack_17c0;
                                auVar13._0_8_ = local_17c8;
                                fVar134 = (float)((ulong)local_17c8 >> 0x20);
                                fVar137 = (float)((ulong)uStack_17c0 >> 0x20);
                                auVar115 = rcpps(auVar63,auVar13);
                                fVar162 = auVar115._0_4_;
                                fVar166 = auVar115._4_4_;
                                fVar170 = auVar115._8_4_;
                                fVar174 = auVar115._12_4_;
                                fVar162 = (float)(-(uint)(1e-18 <= ABS((float)local_17c8)) &
                                                 (uint)((1.0 - (float)local_17c8 * fVar162) *
                                                        fVar162 + fVar162));
                                fVar166 = (float)(-(uint)(1e-18 <= ABS(fVar134)) &
                                                 (uint)((1.0 - fVar134 * fVar166) * fVar166 +
                                                       fVar166));
                                fVar170 = (float)(-(uint)(1e-18 <= ABS((float)uStack_17c0)) &
                                                 (uint)((1.0 - (float)uStack_17c0 * fVar170) *
                                                        fVar170 + fVar170));
                                fVar174 = (float)(-(uint)(1e-18 <= ABS(fVar137)) &
                                                 (uint)((1.0 - fVar137 * fVar174) * fVar174 +
                                                       fVar174));
                                auVar64._0_4_ = (float)local_17a8 * fVar162;
                                auVar64._4_4_ = local_17a8._4_4_ * fVar166;
                                auVar64._8_4_ = (float)uStack_17a0 * fVar170;
                                auVar64._12_4_ = uStack_17a0._4_4_ * fVar174;
                                auVar10._8_4_ = 0x3f800000;
                                auVar10._0_8_ = &DAT_3f8000003f800000;
                                auVar10._12_4_ = 0x3f800000;
                                minps(auVar64,auVar10);
                                auVar44._0_4_ = fVar162 * (float)local_17b8;
                                auVar44._4_4_ = fVar166 * local_17b8._4_4_;
                                auVar44._8_4_ = fVar170 * (float)uStack_17b0;
                                auVar44._12_4_ = fVar174 * uStack_17b0._4_4_;
                                auVar11._8_4_ = 0x3f800000;
                                auVar11._0_8_ = &DAT_3f8000003f800000;
                                auVar11._12_4_ = 0x3f800000;
                                minps(auVar44,auVar11);
                                p0.field_0._0_8_ = local_17e8._0_8_;
                                p0.field_0._8_8_ = local_17e8._8_8_;
                                p0.field_0._16_8_ = local_17f8._0_8_;
                                p0.field_0._24_8_ = local_17f8._8_8_;
                                p0.field_0._32_8_ = local_1808._0_8_;
                                p0.field_0._40_8_ = local_1808._8_8_;
                                auVar115 = *(undefined1 (*) [16])(ray + 0x80);
                                auVar12._4_4_ = fStack_17d4;
                                auVar12._0_4_ = local_17d8;
                                auVar12._8_4_ = fStack_17d0;
                                auVar12._12_4_ = fStack_17cc;
                                auVar146 = blendvps(auVar115,auVar12,(undefined1  [16])aVar56);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar146;
                                itime.field_0 = aVar56;
                                p1.field_0._0_8_ = &itime;
                                p1.field_0._8_8_ = pGVar24->userPtr;
                                p1.field_0._16_8_ = context->user;
                                p1.field_0._24_8_ = ray;
                                p1.field_0._32_8_ = &p0;
                                p1.field_0._40_4_ = 4;
                                uVar22 = pGVar24->occlusionFilterN;
                                if ((RTCFilterFunctionN)uVar22 != (RTCFilterFunctionN)0x0) {
                                  valid_i = (vint<4> *)&p1;
                                  uVar22 = (*(code *)uVar22)((RTCFilterFunctionNArguments *)valid_i)
                                  ;
                                }
                                if (itime.field_0 ==
                                    (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                  auVar65._8_4_ = 0xffffffff;
                                  auVar65._0_8_ = 0xffffffffffffffff;
                                  auVar65._12_4_ = 0xffffffff;
                                  auVar65 = auVar65 ^ _DAT_01febe20;
                                }
                                else {
                                  p_Var5 = context->args->filter;
                                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                                    valid_i = (vint<4> *)&p1;
                                    (*p_Var5)((RTCFilterFunctionNArguments *)valid_i);
                                  }
                                  auVar45._0_4_ = -(uint)(itime.field_0.i[0] == 0);
                                  auVar45._4_4_ = -(uint)(itime.field_0.i[1] == 0);
                                  auVar45._8_4_ = -(uint)(itime.field_0.i[2] == 0);
                                  auVar45._12_4_ = -(uint)(itime.field_0.i[3] == 0);
                                  auVar65 = auVar45 ^ _DAT_01febe20;
                                  auVar146 = blendvps(_DAT_01feba00,
                                                      *(undefined1 (*) [16])
                                                       (p1.field_0._24_8_ + 0x80),auVar45);
                                  *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar146;
                                  uVar22 = p1.field_0._24_8_;
                                }
                                uVar23 = (undefined4)uVar22;
                                auVar66._0_4_ = auVar65._0_4_ << 0x1f;
                                auVar66._4_4_ = auVar65._4_4_ << 0x1f;
                                auVar66._8_4_ = auVar65._8_4_ << 0x1f;
                                auVar66._12_4_ = auVar65._12_4_ << 0x1f;
                                aVar56._0_4_ = auVar66._0_4_ >> 0x1f;
                                aVar56._4_4_ = auVar66._4_4_ >> 0x1f;
                                aVar56._8_4_ = auVar66._8_4_ >> 0x1f;
                                aVar56._12_4_ = auVar66._12_4_ >> 0x1f;
                                auVar115 = blendvps(auVar115,*(undefined1 (*) [16])(ray + 0x80),
                                                    auVar66);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar115;
                              }
                              auVar93 = ~(undefined1  [16])aVar56 & auVar93;
                            }
                            fVar174 = 1.0;
                            fVar170 = 1.0;
                            fVar166 = 1.0;
                            fVar162 = 1.0;
                            uVar17 = movmskps(uVar23,auVar93);
                            uVar21 = (ulong)uVar17;
                            if ((uVar17 == 0) ||
                               (uVar21 = uVar31 + 1, bVar34 = 2 < uVar31, uVar31 = uVar21, bVar34))
                            break;
                          }
                          auVar87._0_4_ = auVar85._0_4_ & auVar93._0_4_;
                          auVar87._4_4_ = auVar85._4_4_ & auVar93._4_4_;
                          auVar87._8_4_ = auVar85._8_4_ & auVar93._8_4_;
                          auVar87._12_4_ = auVar85._12_4_ & auVar93._12_4_;
                          iVar16 = movmskps((int)uVar21,auVar87);
                        } while ((iVar16 != 0) &&
                                (uVar18 = uVar18 + 1, auVar85 = auVar87, uVar18 < uVar19));
                        uVar19 = CONCAT44(auVar87._4_4_,auVar87._0_4_);
                        aVar88._0_8_ = uVar19 ^ 0xffffffffffffffff;
                        aVar88._8_4_ = auVar87._8_4_ ^ 0xffffffff;
                        aVar88._12_4_ = auVar87._12_4_ ^ 0xffffffff;
                      }
                      terminated.field_0 =
                           (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                           ((undefined1  [16])aVar88 | (undefined1  [16])terminated.field_0);
                      iVar16 = movmskps((int)uVar18,(undefined1  [16])terminated.field_0);
                      if (iVar16 == 0xf) goto LAB_00244857;
                      tray.tfar.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                                    (undefined1  [16])terminated.field_0);
                      sVar178 = 0;
                      break;
                    }
                    goto LAB_0024485c;
                  }
                  sVar178 = 3;
                  break;
                }
                uVar18 = root.ptr & 0xfffffffffffffff0;
                uVar17 = (uint)root.ptr & 7;
                pIVar25 = (Intersectors *)0x0;
                sVar178 = 8;
                aVar153 = _DAT_01feb9f0;
                do {
                  sVar2 = *(size_t *)(uVar18 + (long)pIVar25 * 8);
                  root.ptr = sVar178;
                  aVar59 = aVar153;
                  if (sVar2 != 8) {
                    fVar49 = *(float *)(uVar18 + 0x80 + (long)pIVar25 * 4);
                    fVar72 = *(float *)(uVar18 + 0x20 + (long)pIVar25 * 4);
                    fVar84 = *(float *)(uVar18 + 0x30 + (long)pIVar25 * 4);
                    fVar79 = *(float *)(uVar18 + 0x40 + (long)pIVar25 * 4);
                    fVar89 = *(float *)(uVar18 + 0x50 + (long)pIVar25 * 4);
                    auVar93 = *(undefined1 (*) [16])(ray + 0x70);
                    fVar57 = auVar93._0_4_;
                    fVar67 = auVar93._4_4_;
                    fVar68 = auVar93._8_4_;
                    fVar70 = auVar93._12_4_;
                    fVar80 = *(float *)(uVar18 + 0xa0 + (long)pIVar25 * 4);
                    fVar83 = *(float *)(uVar18 + 0xc0 + (long)pIVar25 * 4);
                    fVar90 = *(float *)(uVar18 + 0x60 + (long)pIVar25 * 4);
                    fVar91 = *(float *)(uVar18 + 0x90 + (long)pIVar25 * 4);
                    fVar107 = *(float *)(uVar18 + 0xb0 + (long)pIVar25 * 4);
                    fVar149 = *(float *)(uVar18 + 0xd0 + (long)pIVar25 * 4);
                    fVar150 = *(float *)(uVar18 + 0x70 + (long)pIVar25 * 4);
                    fVar35 = ((fVar49 * fVar57 + fVar72) - (float)tray.org.field_0._0_4_) *
                             tray.rdir.field_0._0_4_;
                    fVar47 = ((fVar49 * fVar67 + fVar72) - (float)tray.org.field_0._4_4_) *
                             tray.rdir.field_0._4_4_;
                    fVar48 = ((fVar49 * fVar68 + fVar72) - (float)tray.org.field_0._8_4_) *
                             tray.rdir.field_0._8_4_;
                    fVar49 = ((fVar49 * fVar70 + fVar72) - (float)tray.org.field_0._12_4_) *
                             tray.rdir.field_0._12_4_;
                    fVar72 = ((fVar80 * fVar57 + fVar79) - (float)tray.org.field_0._16_4_) *
                             tray.rdir.field_0._16_4_;
                    fVar76 = ((fVar80 * fVar67 + fVar79) - (float)tray.org.field_0._20_4_) *
                             tray.rdir.field_0._20_4_;
                    fVar78 = ((fVar80 * fVar68 + fVar79) - (float)tray.org.field_0._24_4_) *
                             tray.rdir.field_0._24_4_;
                    fVar79 = ((fVar80 * fVar70 + fVar79) - (float)tray.org.field_0._28_4_) *
                             tray.rdir.field_0._28_4_;
                    fVar80 = ((fVar83 * fVar57 + fVar90) - (float)tray.org.field_0._32_4_) *
                             (float)tray.rdir.field_0._32_4_;
                    fVar81 = ((fVar83 * fVar67 + fVar90) - (float)tray.org.field_0._36_4_) *
                             (float)tray.rdir.field_0._36_4_;
                    fVar82 = ((fVar83 * fVar68 + fVar90) - (float)tray.org.field_0._40_4_) *
                             (float)tray.rdir.field_0._40_4_;
                    fVar83 = ((fVar83 * fVar70 + fVar90) - (float)tray.org.field_0._44_4_) *
                             (float)tray.rdir.field_0._44_4_;
                    fVar92 = ((fVar91 * fVar57 + fVar84) - (float)tray.org.field_0._0_4_) *
                             tray.rdir.field_0._0_4_;
                    fVar97 = ((fVar91 * fVar67 + fVar84) - (float)tray.org.field_0._4_4_) *
                             tray.rdir.field_0._4_4_;
                    fVar98 = ((fVar91 * fVar68 + fVar84) - (float)tray.org.field_0._8_4_) *
                             tray.rdir.field_0._8_4_;
                    fVar99 = ((fVar91 * fVar70 + fVar84) - (float)tray.org.field_0._12_4_) *
                             tray.rdir.field_0._12_4_;
                    fVar100 = ((fVar107 * fVar57 + fVar89) - (float)tray.org.field_0._16_4_) *
                              tray.rdir.field_0._16_4_;
                    fVar103 = ((fVar107 * fVar67 + fVar89) - (float)tray.org.field_0._20_4_) *
                              tray.rdir.field_0._20_4_;
                    fVar105 = ((fVar107 * fVar68 + fVar89) - (float)tray.org.field_0._24_4_) *
                              tray.rdir.field_0._24_4_;
                    fVar107 = ((fVar107 * fVar70 + fVar89) - (float)tray.org.field_0._28_4_) *
                              tray.rdir.field_0._28_4_;
                    fVar84 = ((fVar149 * fVar57 + fVar150) - (float)tray.org.field_0._32_4_) *
                             (float)tray.rdir.field_0._32_4_;
                    fVar89 = ((fVar149 * fVar67 + fVar150) - (float)tray.org.field_0._36_4_) *
                             (float)tray.rdir.field_0._36_4_;
                    fVar90 = ((fVar149 * fVar68 + fVar150) - (float)tray.org.field_0._40_4_) *
                             (float)tray.rdir.field_0._40_4_;
                    fVar91 = ((fVar149 * fVar70 + fVar150) - (float)tray.org.field_0._44_4_) *
                             (float)tray.rdir.field_0._44_4_;
                    uVar109 = (uint)((int)fVar92 < (int)fVar35) * (int)fVar92 |
                              (uint)((int)fVar92 >= (int)fVar35) * (int)fVar35;
                    uVar119 = (uint)((int)fVar97 < (int)fVar47) * (int)fVar97 |
                              (uint)((int)fVar97 >= (int)fVar47) * (int)fVar47;
                    uVar122 = (uint)((int)fVar98 < (int)fVar48) * (int)fVar98 |
                              (uint)((int)fVar98 >= (int)fVar48) * (int)fVar48;
                    uVar124 = (uint)((int)fVar99 < (int)fVar49) * (int)fVar99 |
                              (uint)((int)fVar99 >= (int)fVar49) * (int)fVar49;
                    uVar126 = (uint)((int)fVar100 < (int)fVar72) * (int)fVar100 |
                              (uint)((int)fVar100 >= (int)fVar72) * (int)fVar72;
                    uVar127 = (uint)((int)fVar103 < (int)fVar76) * (int)fVar103 |
                              (uint)((int)fVar103 >= (int)fVar76) * (int)fVar76;
                    uVar128 = (uint)((int)fVar105 < (int)fVar78) * (int)fVar105 |
                              (uint)((int)fVar105 >= (int)fVar78) * (int)fVar78;
                    uVar129 = (uint)((int)fVar107 < (int)fVar79) * (int)fVar107 |
                              (uint)((int)fVar107 >= (int)fVar79) * (int)fVar79;
                    uVar126 = ((int)uVar126 < (int)uVar109) * uVar109 |
                              ((int)uVar126 >= (int)uVar109) * uVar126;
                    uVar127 = ((int)uVar127 < (int)uVar119) * uVar119 |
                              ((int)uVar127 >= (int)uVar119) * uVar127;
                    uVar128 = ((int)uVar128 < (int)uVar122) * uVar122 |
                              ((int)uVar128 >= (int)uVar122) * uVar128;
                    uVar129 = ((int)uVar129 < (int)uVar124) * uVar124 |
                              ((int)uVar129 >= (int)uVar124) * uVar129;
                    uVar109 = (uint)((int)fVar84 < (int)fVar80) * (int)fVar84 |
                              (uint)((int)fVar84 >= (int)fVar80) * (int)fVar80;
                    uVar119 = (uint)((int)fVar89 < (int)fVar81) * (int)fVar89 |
                              (uint)((int)fVar89 >= (int)fVar81) * (int)fVar81;
                    uVar122 = (uint)((int)fVar90 < (int)fVar82) * (int)fVar90 |
                              (uint)((int)fVar90 >= (int)fVar82) * (int)fVar82;
                    uVar124 = (uint)((int)fVar91 < (int)fVar83) * (int)fVar91 |
                              (uint)((int)fVar91 >= (int)fVar83) * (int)fVar83;
                    auVar113._0_4_ =
                         (float)(((int)uVar109 < (int)uVar126) * uVar126 |
                                ((int)uVar109 >= (int)uVar126) * uVar109) * 0.99999964;
                    auVar113._4_4_ =
                         (float)(((int)uVar119 < (int)uVar127) * uVar127 |
                                ((int)uVar119 >= (int)uVar127) * uVar119) * 0.99999964;
                    auVar113._8_4_ =
                         (float)(((int)uVar122 < (int)uVar128) * uVar128 |
                                ((int)uVar122 >= (int)uVar128) * uVar122) * 0.99999964;
                    auVar113._12_4_ =
                         (float)(((int)uVar124 < (int)uVar129) * uVar129 |
                                ((int)uVar124 >= (int)uVar129) * uVar124) * 0.99999964;
                    uVar109 = (uint)((int)fVar92 < (int)fVar35) * (int)fVar35 |
                              (uint)((int)fVar92 >= (int)fVar35) * (int)fVar92;
                    uVar119 = (uint)((int)fVar97 < (int)fVar47) * (int)fVar47 |
                              (uint)((int)fVar97 >= (int)fVar47) * (int)fVar97;
                    uVar122 = (uint)((int)fVar98 < (int)fVar48) * (int)fVar48 |
                              (uint)((int)fVar98 >= (int)fVar48) * (int)fVar98;
                    uVar124 = (uint)((int)fVar99 < (int)fVar49) * (int)fVar49 |
                              (uint)((int)fVar99 >= (int)fVar49) * (int)fVar99;
                    uVar126 = (uint)((int)fVar100 < (int)fVar72) * (int)fVar72 |
                              (uint)((int)fVar100 >= (int)fVar72) * (int)fVar100;
                    uVar127 = (uint)((int)fVar103 < (int)fVar76) * (int)fVar76 |
                              (uint)((int)fVar103 >= (int)fVar76) * (int)fVar103;
                    uVar128 = (uint)((int)fVar105 < (int)fVar78) * (int)fVar78 |
                              (uint)((int)fVar105 >= (int)fVar78) * (int)fVar105;
                    uVar129 = (uint)((int)fVar107 < (int)fVar79) * (int)fVar79 |
                              (uint)((int)fVar107 >= (int)fVar79) * (int)fVar107;
                    uVar126 = ((int)uVar109 < (int)uVar126) * uVar109 |
                              ((int)uVar109 >= (int)uVar126) * uVar126;
                    uVar127 = ((int)uVar119 < (int)uVar127) * uVar119 |
                              ((int)uVar119 >= (int)uVar127) * uVar127;
                    uVar128 = ((int)uVar122 < (int)uVar128) * uVar122 |
                              ((int)uVar122 >= (int)uVar128) * uVar128;
                    uVar129 = ((int)uVar124 < (int)uVar129) * uVar124 |
                              ((int)uVar124 >= (int)uVar129) * uVar129;
                    uVar109 = (uint)((int)fVar84 < (int)fVar80) * (int)fVar80 |
                              (uint)((int)fVar84 >= (int)fVar80) * (int)fVar84;
                    uVar119 = (uint)((int)fVar89 < (int)fVar81) * (int)fVar81 |
                              (uint)((int)fVar89 >= (int)fVar81) * (int)fVar89;
                    uVar122 = (uint)((int)fVar90 < (int)fVar82) * (int)fVar82 |
                              (uint)((int)fVar90 >= (int)fVar82) * (int)fVar90;
                    uVar124 = (uint)((int)fVar91 < (int)fVar83) * (int)fVar83 |
                              (uint)((int)fVar91 >= (int)fVar83) * (int)fVar91;
                    fVar49 = (float)(((int)uVar126 < (int)uVar109) * uVar126 |
                                    ((int)uVar126 >= (int)uVar109) * uVar109) * 1.0000004;
                    fVar72 = (float)(((int)uVar127 < (int)uVar119) * uVar127 |
                                    ((int)uVar127 >= (int)uVar119) * uVar119) * 1.0000004;
                    fVar84 = (float)(((int)uVar128 < (int)uVar122) * uVar128 |
                                    ((int)uVar128 >= (int)uVar122) * uVar122) * 1.0000004;
                    fVar79 = (float)(((int)uVar129 < (int)uVar124) * uVar129 |
                                    ((int)uVar129 >= (int)uVar124) * uVar124) * 1.0000004;
                    bVar34 = (float)((uint)(tray.tnear.field_0.i[0] < (int)auVar113._0_4_) *
                                     (int)auVar113._0_4_ |
                                    (uint)(tray.tnear.field_0.i[0] >= (int)auVar113._0_4_) *
                                    tray.tnear.field_0.i[0]) <=
                             (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar49) *
                                     tray.tfar.field_0.i[0] |
                                    (uint)(tray.tfar.field_0.i[0] >= (int)fVar49) * (int)fVar49);
                    bVar6 = (float)((uint)(tray.tnear.field_0.i[1] < (int)auVar113._4_4_) *
                                    (int)auVar113._4_4_ |
                                   (uint)(tray.tnear.field_0.i[1] >= (int)auVar113._4_4_) *
                                   tray.tnear.field_0.i[1]) <=
                            (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar72) *
                                    tray.tfar.field_0.i[1] |
                                   (uint)(tray.tfar.field_0.i[1] >= (int)fVar72) * (int)fVar72);
                    bVar7 = (float)((uint)(tray.tnear.field_0.i[2] < (int)auVar113._8_4_) *
                                    (int)auVar113._8_4_ |
                                   (uint)(tray.tnear.field_0.i[2] >= (int)auVar113._8_4_) *
                                   tray.tnear.field_0.i[2]) <=
                            (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar84) *
                                    tray.tfar.field_0.i[2] |
                                   (uint)(tray.tfar.field_0.i[2] >= (int)fVar84) * (int)fVar84);
                    bVar8 = (float)((uint)(tray.tnear.field_0.i[3] < (int)auVar113._12_4_) *
                                    (int)auVar113._12_4_ |
                                   (uint)(tray.tnear.field_0.i[3] >= (int)auVar113._12_4_) *
                                   tray.tnear.field_0.i[3]) <=
                            (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar79) *
                                    tray.tfar.field_0.i[3] |
                                   (uint)(tray.tfar.field_0.i[3] >= (int)fVar79) * (int)fVar79);
                    if (uVar17 == 6) {
                      fVar49 = *(float *)(uVar18 + 0xe0 + (long)pIVar25 * 4);
                      fVar72 = *(float *)(uVar18 + 0xf0 + (long)pIVar25 * 4);
                      bVar34 = (fVar57 < fVar72 && fVar49 <= fVar57) && bVar34;
                      bVar6 = (fVar67 < fVar72 && fVar49 <= fVar67) && bVar6;
                      bVar7 = (fVar68 < fVar72 && fVar49 <= fVar68) && bVar7;
                      bVar8 = (fVar70 < fVar72 && fVar49 <= fVar70) && bVar8;
                    }
                    auVar37._0_4_ =
                         (-(uint)bVar34 & -(uint)(fVar134 < tray.tfar.field_0.v[0])) << 0x1f;
                    auVar37._4_4_ =
                         (-(uint)bVar6 & -(uint)(fVar137 < tray.tfar.field_0.v[1])) << 0x1f;
                    auVar37._8_4_ =
                         (-(uint)bVar7 & -(uint)(fVar139 < tray.tfar.field_0.v[2])) << 0x1f;
                    auVar37._12_4_ =
                         (-(uint)bVar8 & -(uint)(fVar141 < tray.tfar.field_0.v[3])) << 0x1f;
                    uVar109 = movmskps((int)valid_i,auVar37);
                    valid_i = (vint<4> *)(ulong)uVar109;
                    if ((uVar109 != 0) &&
                       (aVar59.v = (__m128)blendvps(_DAT_01feb9f0,auVar113,auVar37),
                       root.ptr = sVar2, sVar178 != 8)) {
                      pNVar33->ptr = sVar178;
                      pNVar33 = pNVar33 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar30->v = aVar153;
                      paVar30 = paVar30 + 1;
                    }
                  }
                } while ((sVar2 != 8) &&
                        (valid_i = (vint<4> *)((long)&pIVar25->ptr + 1),
                        bVar34 = pIVar25 < (Intersectors *)0x3, pIVar25 = (Intersectors *)valid_i,
                        sVar178 = root.ptr, aVar153 = aVar59, bVar34));
                sVar178 = 0;
                if (root.ptr == 8) {
LAB_00243b08:
                  bVar34 = false;
                  sVar178 = 4;
                }
                else {
                  auVar38._4_4_ = -(uint)(aVar59.v[1] < tray.tfar.field_0.v[1]);
                  auVar38._0_4_ = -(uint)(aVar59.v[0] < tray.tfar.field_0.v[0]);
                  auVar38._8_4_ = -(uint)(aVar59.v[2] < tray.tfar.field_0.v[2]);
                  auVar38._12_4_ = -(uint)(aVar59.v[3] < tray.tfar.field_0.v[3]);
                  uVar23 = movmskps(uVar17,auVar38);
                  bVar34 = true;
                  if ((uint)POPCOUNT(uVar23) <= uVar29) {
                    pNVar33->ptr = root.ptr;
                    pNVar33 = pNVar33 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar30->v = aVar59;
                    paVar30 = paVar30 + 1;
                    goto LAB_00243b08;
                  }
                }
              } while (bVar34);
            }
          }
        }
      } while ((int)sVar178 != 3);
      auVar46._4_4_ = uVar148 & terminated.field_0.i[1];
      auVar46._0_4_ = uVar143 & terminated.field_0.i[0];
      auVar46._8_4_ = auVar144._8_4_ & terminated.field_0.i[2];
      auVar46._12_4_ = auVar144._12_4_ & terminated.field_0.i[3];
      auVar93 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar46);
      *(undefined1 (*) [16])(ray + 0x80) = auVar93;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }